

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_qpromiseconnections.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 local_48 [8];
  tst_qpromiseconnections tc;
  QCoreApplication local_28 [8];
  QCoreApplication app;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  argv_local._0_4_ = argc;
  QTest::Internal::callInitMain<tst_qpromiseconnections>();
  QCoreApplication::QCoreApplication(local_28,(int *)&argv_local,argv,0x60204);
  QCoreApplication::setAttribute(AA_Use96Dpi,true);
  tst_qpromiseconnections::tst_qpromiseconnections((tst_qpromiseconnections *)local_48);
  QTest::setMainSourcePath
            ("/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromiseconnections/tst_qpromiseconnections.cpp"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/build_O0/tests/auto/qtpromise/qpromiseconnections"
            );
  argv_local._4_4_ = QTest::qExec((QObject *)local_48,(int)argv_local,argv);
  tst_qpromiseconnections::~tst_qpromiseconnections((tst_qpromiseconnections *)local_48);
  QCoreApplication::~QCoreApplication(local_28);
  return argv_local._4_4_;
}

Assistant:

void tst_qpromiseconnections::connections()
{
    Object sender;

    QtPromise::QPromiseConnections connections;
    QCOMPARE(sender.hasConnections(), false);
    QCOMPARE(connections.count(), 0);

    connections << connect(&sender, &Object::noArgSignal, [=]() {});
    QCOMPARE(sender.hasConnections(), true);
    QCOMPARE(connections.count(), 1);

    connections << connect(&sender, &Object::twoArgsSignal, [=]() {});
    QCOMPARE(sender.hasConnections(), true);
    QCOMPARE(connections.count(), 2);

    connections.disconnect();
    QCOMPARE(sender.hasConnections(), false);
    QCOMPARE(connections.count(), 0);
}